

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O3

void Sim_CollectNodes_rec(Abc_Obj_t *pRoot,Vec_Ptr_t *vField)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  void **ppvVar6;
  int in_EDX;
  int Fill;
  int Fill_00;
  long lVar7;
  
  pAVar4 = pRoot->pNtk;
  iVar1 = pRoot->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,in_EDX);
  if ((-1 < (long)iVar1) && (iVar1 < (pAVar4->vTravIds).nSize)) {
    pAVar5 = pRoot->pNtk;
    if ((pAVar4->vTravIds).pArray[iVar1] != pAVar5->nTravIds) {
      iVar1 = pRoot->Id;
      Vec_IntFillExtra(&pAVar5->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar5->vTravIds).nSize <= iVar1)) goto LAB_0029fb2b;
      pAVar4 = pRoot->pNtk;
      iVar2 = pAVar4->nTravIds;
      if ((pAVar5->vTravIds).pArray[iVar1] == iVar2 + -1) {
        iVar1 = pRoot->Id;
        Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill_00);
        if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pAVar4->vTravIds).pArray[iVar1] = iVar2;
        if (0 < (pRoot->vFanins).nSize) {
          lVar7 = 0;
          do {
            Sim_CollectNodes_rec
                      ((Abc_Obj_t *)pRoot->pNtk->vObjs->pArray[(pRoot->vFanins).pArray[lVar7]],
                       vField);
            lVar7 = lVar7 + 1;
          } while (lVar7 < (pRoot->vFanins).nSize);
        }
        if ((*(uint *)&pRoot->field_0x14 & 0xf) - 5 < 0xfffffffe) {
          pRoot->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)(long)vField->nSize;
        }
        uVar3 = vField->nSize;
        if (uVar3 == vField->nCap) {
          if ((int)uVar3 < 0x10) {
            if (vField->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vField->pArray,0x80);
            }
            vField->pArray = ppvVar6;
            vField->nCap = 0x10;
          }
          else {
            if (vField->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vField->pArray,(ulong)uVar3 << 4);
            }
            vField->pArray = ppvVar6;
            vField->nCap = uVar3 * 2;
          }
        }
        else {
          ppvVar6 = vField->pArray;
        }
        iVar1 = vField->nSize;
        vField->nSize = iVar1 + 1;
        ppvVar6[iVar1] = pRoot;
      }
    }
    return;
  }
LAB_0029fb2b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sim_CollectNodes_rec( Abc_Obj_t * pRoot, Vec_Ptr_t * vField )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_NodeIsTravIdCurrent(pRoot) )
        return;
    if ( !Abc_NodeIsTravIdPrevious(pRoot) )
        return;
    Abc_NodeSetTravIdCurrent( pRoot );
    Abc_ObjForEachFanin( pRoot, pFanin, i )
        Sim_CollectNodes_rec( pFanin, vField );
    if ( !Abc_ObjIsCo(pRoot) )
        pRoot->pData = (void *)(ABC_PTRUINT_T)Vec_PtrSize(vField);
    Vec_PtrPush( vField, pRoot );
}